

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O2

void __thiscall glTF2::AssetMetadata::AssetMetadata(AssetMetadata *this)

{
  allocator local_21;
  
  (this->copyright)._M_dataplus._M_p = (pointer)&(this->copyright).field_2;
  (this->copyright)._M_string_length = 0;
  (this->copyright).field_2._M_local_buf[0] = '\0';
  (this->generator)._M_dataplus._M_p = (pointer)&(this->generator).field_2;
  (this->generator)._M_string_length = 0;
  (this->generator).field_2._M_local_buf[0] = '\0';
  (this->profile).api._M_dataplus._M_p = (pointer)&(this->profile).api.field_2;
  (this->profile).api._M_string_length = 0;
  (this->profile).api.field_2._M_local_buf[0] = '\0';
  (this->profile).version._M_dataplus._M_p = (pointer)&(this->profile).version.field_2;
  (this->profile).version._M_string_length = 0;
  (this->profile).version.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->version,"",&local_21);
  return;
}

Assistant:

AssetMetadata() : version("") {}